

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Node256DeleteBeginningMiddleEnd_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node256DeleteBeginningMiddleEnd_Test
          (ARTCorrectnessTest_Node256DeleteBeginningMiddleEnd_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_Node256DeleteBeginningMiddleEnd_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTCorrectnessTest_Node256DeleteBeginningMiddleEnd_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node256DeleteBeginningMiddleEnd) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 256);

  unodb::test::must_not_allocate([&verifier] {
    verifier.remove(180);
    verifier.remove(1);
    verifier.remove(256);
  });

  verifier.check_present_values();
  verifier.check_absent_keys({0, 1, 180, 256});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({253, 0, 0, 0, 1});
#endif  // UNODB_DETAIL_WITH_STATS
}